

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O1

void autocorr_fft(auto_fft_object obj,double *vec,double *acorr,int M)

{
  double dVar1;
  int iVar2;
  ulong uVar3;
  uint M_00;
  
  iVar2 = obj->clen;
  if (iVar2 < M) {
    puts(
        "\n Lag is greater than the length N of the input vector. It is automatically set to length N - 1."
        );
    printf("\n The Output Vector only contains N calculated values.");
    M_00 = iVar2 - 1;
  }
  else {
    M_00 = 0;
    if (0 < M) {
      M_00 = M;
    }
  }
  autocovar_fft(obj,vec,acorr,M_00);
  dVar1 = *acorr;
  *acorr = 1.0;
  if (1 < (int)M_00) {
    uVar3 = 1;
    do {
      acorr[uVar3] = acorr[uVar3] / dVar1;
      uVar3 = uVar3 + 1;
    } while (M_00 != uVar3);
  }
  return;
}

Assistant:

void autocorr_fft(auto_fft_object obj,double* vec,double* acorr, int M) {
	double var;
	int i,N;
	N = obj->clen;
	if (M > N) {
		M = N - 1;
		printf("\n Lag is greater than the length N of the input vector. It is automatically set to length N - 1.\n");
		printf("\n The Output Vector only contains N calculated values.");
	}
	else if (M < 0) {
		M = 0;
	}
	autocovar_fft(obj,vec,acorr,M);
	var = acorr[0];
	acorr[0] = 1.0;
	
	for(i = 1; i < M; i++) {
		acorr[i] = acorr[i]/var;
	}
	
}